

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shared_alloc.hpp
# Opt level: O2

void __thiscall Omega_h::Write<double>::Write(Write<double> *this,Write<double> *param_2)

{
  Alloc *pAVar1;
  
  pAVar1 = (param_2->shared_alloc_).alloc;
  (this->shared_alloc_).alloc = pAVar1;
  if (((ulong)pAVar1 & 7) == 0 && pAVar1 != (Alloc *)0x0) {
    if ((char)entering_parallel == '\x01') {
      (this->shared_alloc_).alloc = (Alloc *)(*(long *)pAVar1 * 8 + 1);
    }
    else {
      *(int *)(pAVar1 + 0x30) = *(int *)(pAVar1 + 0x30) + 1;
    }
  }
  (this->shared_alloc_).direct_ptr = (param_2->shared_alloc_).direct_ptr;
  return;
}

Assistant:

OMEGA_H_INLINE void copy(SharedAlloc const& other) noexcept {
    alloc = other.alloc;
#ifndef __CUDA_ARCH__
    if (alloc && (!(reinterpret_cast<std::uintptr_t>(alloc) & FREE_MASK))) {
      // allocated
      if (entering_parallel) {
        alloc = reinterpret_cast<Alloc*>(
            (std::uintptr_t(alloc->size) << 3) | IN_PARALLEL);
      } else {
        ++(alloc->use_count);
      }
    }
#endif
    direct_ptr = other.direct_ptr;
  }